

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O0

m2v * m2v_make(int n_row,int n_col,m2v_base *memory)

{
  int iVar1;
  m2v_base *in_RCX;
  int in_EDX;
  int in_ESI;
  m2v *in_RDI;
  m2v *ret;
  
  in_RDI->n_row = in_ESI;
  in_RDI->n_col = in_EDX;
  iVar1 = m2v_get_row_size(in_EDX);
  in_RDI->row_stride = iVar1;
  in_RDI->e = in_RCX;
  return in_RDI;
}

Assistant:

m2v m2v_make(int n_row, int n_col, m2v_base* memory)
{
	m2v ret;
	ret.n_row = n_row;
	ret.n_col = n_col;

	ret.row_stride = m2v_get_row_size(n_col);
	ret.e = memory;

	return ret;
}